

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall
onmt::Tokenizer::Tokenizer
          (Tokenizer *this,string *sp_model_path,int sp_nbest_size,float sp_alpha,Mode mode,
          int flags,string *joiner)

{
  ITokenizer *in_RDI;
  shared_ptr<const_onmt::SentencePiece> *__r;
  Tokenizer *this_00;
  element_type *in_stack_ffffffffffffffb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  Mode in_stack_ffffffffffffffcc;
  Options *in_stack_ffffffffffffffd0;
  
  ITokenizer::ITokenizer(in_RDI);
  in_RDI->_vptr_ITokenizer = (_func_int **)&PTR__Tokenizer_006efd98;
  Options::Options(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (string *)in_stack_ffffffffffffffc0._M_pi);
  this_00 = (Tokenizer *)(in_RDI + 0x16);
  std::shared_ptr<const_onmt::SubwordEncoder>::shared_ptr
            ((shared_ptr<const_onmt::SubwordEncoder> *)0x3c20bb);
  Options::validate((Options *)CONCAT44(sp_nbest_size,sp_alpha));
  std::make_shared<onmt::SentencePiece_const,std::__cxx11::string_const&,int&,float&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (int *)in_stack_ffffffffffffffc0._M_pi,(float *)in_stack_ffffffffffffffb8);
  __r = (shared_ptr<const_onmt::SentencePiece> *)&stack0xffffffffffffffb8;
  std::shared_ptr<onmt::SubwordEncoder_const>::shared_ptr<onmt::SentencePiece_const,void>
            ((shared_ptr<const_onmt::SubwordEncoder> *)this_00,__r);
  set_subword_encoder(this_00,(shared_ptr<const_onmt::SubwordEncoder> *)__r);
  std::shared_ptr<const_onmt::SubwordEncoder>::~shared_ptr
            ((shared_ptr<const_onmt::SubwordEncoder> *)0x3c2113);
  std::shared_ptr<const_onmt::SentencePiece>::~shared_ptr
            ((shared_ptr<const_onmt::SentencePiece> *)0x3c211d);
  return;
}

Assistant:

Tokenizer::Tokenizer(const std::string& sp_model_path,
                       int sp_nbest_size,
                       float sp_alpha,
                       Mode mode,
                       int flags,
                       const std::string& joiner)
    : _options(mode, flags, joiner)
  {
    _options.validate();
    set_subword_encoder(std::make_shared<const SentencePiece>(sp_model_path, sp_nbest_size, sp_alpha));
  }